

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int validate_retry_tag(quicly_decoded_packet_t *packet,quicly_cid_t *odcid,
                      ptls_aead_context_t *retry_aead)

{
  byte bVar1;
  code *pcVar2;
  ulong uVar3;
  long lVar4;
  long in_RCX;
  ulong __n;
  long alStack_50 [3];
  undefined8 local_38;
  
  bVar1 = *(byte *)((long)&retry_aead->do_xor_iv + 4);
  __n = (ulong)bVar1;
  local_38 = odcid->cid + __n + 1;
  uVar3 = (ulong)(odcid->cid + __n + 0x10) & 0xfffffffffffffff0;
  lVar4 = -uVar3;
  *(byte *)((long)&local_38 - uVar3) = bVar1;
  *(undefined8 *)((long)alStack_50 + lVar4 + 0x10) = 0x1236e5;
  memcpy((void *)((long)&local_38 + lVar4 + 1),retry_aead,__n);
  *(undefined8 *)((long)alStack_50 + lVar4 + 0x10) = 0x1236f7;
  memcpy((void *)((long)&local_38 + __n + lVar4 + 1),packet,(size_t)odcid);
  *(uint8_t **)((long)alStack_50 + lVar4 + 8) = local_38;
  pcVar2 = *(code **)(in_RCX + 0x38);
  *(undefined8 *)((long)alStack_50 + lVar4) = 0x123718;
  lVar4 = (*pcVar2)();
  return (int)(lVar4 == 0);
}

Assistant:

static int validate_retry_tag(quicly_decoded_packet_t *packet, quicly_cid_t *odcid, ptls_aead_context_t *retry_aead)
{
    size_t pseudo_packet_len = 1 + odcid->len + packet->encrypted_off;
    uint8_t pseudo_packet[pseudo_packet_len];
    pseudo_packet[0] = odcid->len;
    memcpy(pseudo_packet + 1, odcid->cid, odcid->len);
    memcpy(pseudo_packet + 1 + odcid->len, packet->octets.base, packet->encrypted_off);
    return ptls_aead_decrypt(retry_aead, packet->octets.base + packet->encrypted_off, packet->octets.base + packet->encrypted_off,
                             PTLS_AESGCM_TAG_SIZE, 0, pseudo_packet, pseudo_packet_len) == 0;
}